

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.hpp
# Opt level: O2

span_t * lattice::extent(span_t *__return_storage_ptr__,size_t L1,size_t L2)

{
  size_t *psVar1;
  int local_20;
  int local_1c;
  
  local_20 = 2;
  local_1c = local_20;
  Eigen::Matrix<long,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<long,_1,_1,0,_1,_1> *)__return_storage_ptr__,&local_1c,&local_20);
  Eigen::DenseBase<Eigen::Matrix<long,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_> *)__return_storage_ptr__);
  psVar1 = (size_t *)
           (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>).
           m_storage.m_data;
  *psVar1 = L1;
  psVar1[(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>).
         m_storage.m_rows + 1] = L2;
  return __return_storage_ptr__;
}

Assistant:

inline span_t extent(std::size_t L1, std::size_t L2) {
  span_t span(2, 2); span.setZero();
  span(0, 0) = L1;
  span(1, 1) = L2;
  return span;
}